

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

wchar_t compute_rubble_penalty(player *p)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint uVar4;
  object *obj;
  object *poVar5;
  player_state_conflict *state;
  uint remainder;
  my_rational avg_turns;
  int digging_chances [5];
  player_state_conflict local_state;
  uint8_t local_175;
  uint local_174;
  my_rational local_170;
  uint local_168 [6];
  player_state_conflict local_150;
  
  wVar3 = slot_by_name(p,"weapon");
  obj = slot_object(p,wVar3);
  poVar5 = player_best_digger(p,false);
  if (poVar5 == obj) {
LAB_001a59f6:
    state = &p->state;
    local_175 = '\x01';
    bVar1 = false;
  }
  else {
    if (obj != (object *)0x0) {
      _Var2 = obj_can_takeoff(obj);
      if (!_Var2) goto LAB_001a59f6;
    }
    bVar1 = true;
    local_175 = '\x01';
    if (poVar5 != (object *)0x0) {
      local_175 = poVar5->number;
      poVar5->number = '\x01';
    }
    (p->body).slots[wVar3].obj = poVar5;
    state = &local_150;
    memcpy(state,&p->state,0x120);
    calc_bonuses(p,state,false,true);
  }
  calc_digging_chances(state,(int *)local_168);
  if (bVar1) {
    if (poVar5 != (object *)0x0) {
      poVar5->number = local_175;
    }
    (p->body).slots[wVar3].obj = obj;
    calc_bonuses(p,&local_150,false,true);
  }
  if ((int)local_168[0] < 1) {
    wVar3 = L'\x7fffffff';
  }
  else {
    wVar3 = L'\x10';
    if ((int)local_168[0] < 0x640) {
      local_170 = my_rational_construct(0x640,local_168[0]);
      uVar4 = my_rational_to_uint(&local_170,0x10,&local_174);
      wVar3 = L'\x7fffffff';
      if (uVar4 < 0x7fffffff) {
        wVar3 = (uVar4 + 1) - (uint)(local_174 < local_170.d + 1 >> 1);
      }
    }
  }
  wVar3 = convert_turn_penalty(wVar3,p);
  return wVar3;
}

Assistant:

static int compute_rubble_penalty(struct player *p)
{
	int weapon_slot = slot_by_name(p, "weapon");
	struct object *current_weapon = slot_object(p, weapon_slot);
	struct object *best_digger = player_best_digger(p, false);
	struct player_state local_state, *used_state;
	int digging_chances[DIGGING_MAX], num_digger = 1;
	bool swapped_digger;
	int penalty;

	if (best_digger != current_weapon && (!current_weapon
			|| obj_can_takeoff(current_weapon))) {
		swapped_digger = true;
		if (best_digger) {
			num_digger = best_digger->number;
			best_digger->number = 1;
		}
		p->body.slots[weapon_slot].obj = best_digger;
		memcpy(&local_state, &p->state, sizeof(local_state));
		calc_bonuses(p, &local_state, false, true);
		used_state = &local_state;
	} else {
		swapped_digger = false;
		used_state = &p->state;
	}
	calc_digging_chances(used_state, digging_chances);
	if (swapped_digger) {
		if (best_digger) {
			best_digger->number = num_digger;
		}
		p->body.slots[weapon_slot].obj = current_weapon;
		calc_bonuses(p, &local_state, false, true);
	}
	if (digging_chances[DIGGING_RUBBLE] <= 0) {
		/* Can not dig through rubble at all. */
		penalty = INT_MAX;
	} else if (digging_chances[DIGGING_RUBBLE] >= 1600) {
		/* Takes one turn to dig through rubble. */
		penalty = PF_SCL;
	} else {
		/*
		 * On average, it takes 1600 / digging_chances[DIGGING_RUBBLE]
		 * turns to dig through rubble.  Round the result to the nearest
		 * integer after scaling by PF_SCL.
		 */
		struct my_rational avg_turns = my_rational_construct(1600,
			digging_chances[DIGGING_RUBBLE]);
		unsigned int scl_turns, remainder;

		scl_turns = my_rational_to_uint(&avg_turns, PF_SCL,
			&remainder);
		if (scl_turns < INT_MAX) {
			penalty = (int)scl_turns;
			if (remainder >= (avg_turns.d + 1) / 2) {
				++penalty;
			}
		} else {
			penalty = INT_MAX;
		}
	}

	return convert_turn_penalty(penalty, p);
}